

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blargg_common.h
# Opt level: O2

blargg_err_t __thiscall blargg_vector<char>::resize(blargg_vector<char> *this,size_t n)

{
  char *pcVar1;
  
  pcVar1 = (char *)realloc(this->begin_,n);
  if (n == 0 || pcVar1 != (char *)0x0) {
    this->begin_ = pcVar1;
    this->size_ = n;
    pcVar1 = (blargg_err_t)0x0;
  }
  else {
    pcVar1 = "Out of memory";
  }
  return pcVar1;
}

Assistant:

blargg_err_t resize( size_t n )
	{
		void* p = realloc( begin_, n * sizeof (T) );
		if ( !p && n )
			return "Out of memory";
		begin_ = (T*) p;
		size_ = n;
		return 0;
	}